

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O2

void demo_prepare_texture_image
               (demo *demo,uint32_t *tex_colors,texture_object *tex_obj,VkImageTiling tiling,
               VkImageUsageFlags usage,VkFlags required_props)

{
  VkImage *ppVVar1;
  VkDeviceMemory *ppVVar2;
  _Bool _Var3;
  VkResult VVar4;
  long lVar5;
  long lVar6;
  void *data;
  VkMemoryAllocateInfo mem_alloc;
  VkImageSubresource subres;
  VkSubresourceLayout layout;
  VkMemoryRequirements mem_reqs;
  VkImageCreateInfo local_88;
  
  tex_obj->tex_width = 2;
  tex_obj->tex_height = 2;
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = 0;
  local_88.imageType = VK_IMAGE_TYPE_2D;
  local_88.format = VK_FORMAT_B8G8R8A8_UNORM;
  local_88.extent.width = 2;
  local_88.extent.height = 2;
  local_88.extent.depth = 1;
  local_88.mipLevels = 1;
  local_88.arrayLayers = 1;
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (uint32_t *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;
  mem_alloc.allocationSize = 0;
  mem_alloc.memoryTypeIndex = 0;
  mem_alloc._28_4_ = 0;
  mem_alloc.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  mem_alloc._4_4_ = 0;
  mem_alloc.pNext._0_4_ = 0;
  mem_alloc.pNext._4_4_ = 0;
  ppVVar1 = &tex_obj->image;
  local_88.tiling = tiling;
  local_88.usage = usage;
  VVar4 = (*glad_vkCreateImage)(demo->device,&local_88,(VkAllocationCallbacks *)0x0,ppVVar1);
  if (VVar4 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3b2,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  (*glad_vkGetImageMemoryRequirements)(demo->device,*ppVVar1,&mem_reqs);
  mem_alloc.allocationSize = mem_reqs.size;
  _Var3 = memory_type_from_properties
                    (demo,mem_reqs.memoryTypeBits,required_props,&mem_alloc.memoryTypeIndex);
  if (!_Var3) {
    __assert_fail("pass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3ba,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  ppVVar2 = &tex_obj->mem;
  VVar4 = (*glad_vkAllocateMemory)(demo->device,&mem_alloc,(VkAllocationCallbacks *)0x0,ppVVar2);
  if (VVar4 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3be,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  VVar4 = (*glad_vkBindImageMemory)(demo->device,*ppVVar1,*ppVVar2,0);
  if (VVar4 == VK_SUCCESS) {
    if ((required_props & 2) != 0) {
      subres.arrayLayer = 0;
      subres.aspectMask = 1;
      subres.mipLevel = 0;
      (*glad_vkGetImageSubresourceLayout)(demo->device,*ppVVar1,&subres,&layout);
      VVar4 = (*glad_vkMapMemory)(demo->device,*ppVVar2,0,mem_alloc.allocationSize,0,&data);
      if (VVar4 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                      ,0x3d3,
                      "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                     );
      }
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          *(uint32_t *)((long)data + lVar6 * 4) = tex_colors[(uint)lVar6 ^ (uint)lVar5];
        }
        data = (void *)((long)data + layout.rowPitch);
      }
      (*glad_vkUnmapMemory)(demo->device,*ppVVar2);
    }
    tex_obj->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    demo_set_image_layout
              (demo,tex_obj->image,1,VK_IMAGE_LAYOUT_PREINITIALIZED,
               VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,VK_ACCESS_HOST_WRITE_BIT);
    return;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                ,0x3c2,
                "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
               );
}

Assistant:

static void
demo_prepare_texture_image(struct demo *demo, const uint32_t *tex_colors,
                           struct texture_object *tex_obj, VkImageTiling tiling,
                           VkImageUsageFlags usage, VkFlags required_props) {
    const VkFormat tex_format = VK_FORMAT_B8G8R8A8_UNORM;
    const int32_t tex_width = 2;
    const int32_t tex_height = 2;
    VkResult U_ASSERT_ONLY err;
    bool U_ASSERT_ONLY pass;

    tex_obj->tex_width = tex_width;
    tex_obj->tex_height = tex_height;

    const VkImageCreateInfo image_create_info = {
        .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
        .pNext = NULL,
        .imageType = VK_IMAGE_TYPE_2D,
        .format = tex_format,
        .extent = {tex_width, tex_height, 1},
        .mipLevels = 1,
        .arrayLayers = 1,
        .samples = VK_SAMPLE_COUNT_1_BIT,
        .tiling = tiling,
        .usage = usage,
        .flags = 0,
        .initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED
    };
    VkMemoryAllocateInfo mem_alloc = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0,
    };

    VkMemoryRequirements mem_reqs;

    err =
        vkCreateImage(demo->device, &image_create_info, NULL, &tex_obj->image);
    assert(!err);

    vkGetImageMemoryRequirements(demo->device, tex_obj->image, &mem_reqs);

    mem_alloc.allocationSize = mem_reqs.size;
    pass =
        memory_type_from_properties(demo, mem_reqs.memoryTypeBits,
                                    required_props, &mem_alloc.memoryTypeIndex);
    assert(pass);

    /* allocate memory */
    err = vkAllocateMemory(demo->device, &mem_alloc, NULL, &tex_obj->mem);
    assert(!err);

    /* bind memory */
    err = vkBindImageMemory(demo->device, tex_obj->image, tex_obj->mem, 0);
    assert(!err);

    if (required_props & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) {
        const VkImageSubresource subres = {
            .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
            .mipLevel = 0,
            .arrayLayer = 0,
        };
        VkSubresourceLayout layout;
        void *data;
        int32_t x, y;

        vkGetImageSubresourceLayout(demo->device, tex_obj->image, &subres,
                                    &layout);

        err = vkMapMemory(demo->device, tex_obj->mem, 0,
                          mem_alloc.allocationSize, 0, &data);
        assert(!err);

        for (y = 0; y < tex_height; y++) {
            uint32_t *row = (uint32_t *)((char *)data + layout.rowPitch * y);
            for (x = 0; x < tex_width; x++)
                row[x] = tex_colors[(x & 1) ^ (y & 1)];
        }

        vkUnmapMemory(demo->device, tex_obj->mem);
    }

    tex_obj->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    demo_set_image_layout(demo, tex_obj->image, VK_IMAGE_ASPECT_COLOR_BIT,
                          VK_IMAGE_LAYOUT_PREINITIALIZED, tex_obj->imageLayout,
                          VK_ACCESS_HOST_WRITE_BIT);
    /* setting the image layout does not reference the actual memory so no need
     * to add a mem ref */
}